

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O3

void gog::probe_bin_files(extract_options *o,info *info,path *setup_file,bool external)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pdVar3;
  undefined *puVar4;
  size_t sVar5;
  long *plVar6;
  size_t sVar7;
  pointer pdVar8;
  size_t sVar9;
  size_t sVar10;
  undefined7 in_register_00000009;
  uint uVar11;
  size_type *psVar12;
  size_t sVar13;
  size_t start;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  path dir;
  string local_b8;
  undefined4 local_94;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  path local_50;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,external);
  boost::filesystem::path::parent_path();
  boost::filesystem::path::stem();
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  sVar5 = anon_unknown_0::probe_bin_file_series(o,info,&local_50,&local_b8,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  std::__cxx11::string::append((char *)local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_b8.field_2._M_allocated_capacity = *psVar12;
    local_b8.field_2._8_8_ = plVar6[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar12;
    local_b8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  sVar7 = anon_unknown_0::probe_bin_file_series(o,info,&local_50,&local_b8,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((char)local_94 == '\0') {
    uVar15 = 0;
  }
  else {
    pdVar8 = (info->data_entries).
             super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (info->data_entries).
             super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar8 == pdVar3) {
      uVar15 = 0;
    }
    else {
      uVar11 = 0;
      do {
        uVar14 = (pdVar8->chunk).first_slice;
        uVar2 = (pdVar8->chunk).last_slice;
        if (uVar14 < uVar11) {
          uVar14 = uVar11;
        }
        uVar11 = uVar14;
        if (uVar14 <= uVar2) {
          uVar11 = uVar2;
        }
        uVar15 = (ulong)uVar11;
        pdVar8 = pdVar8 + 1;
      } while (pdVar8 != pdVar3);
    }
    if ((info->header).slices_per_disk == 1) {
      sVar13 = uVar15 + 1;
      goto LAB_00120298;
    }
  }
  sVar13 = 0;
LAB_00120298:
  sVar13 = anon_unknown_0::probe_bin_file_series(o,info,&local_50,&local_90,1,sVar13);
  if (((char)local_94 == '\0') || (sVar9 = (info->header).slices_per_disk, sVar9 == 1)) {
    start = 0;
    sVar9 = 2;
  }
  else {
    start = uVar15 + 1;
  }
  sVar9 = anon_unknown_0::probe_bin_file_series(o,info,&local_50,&local_90,sVar9,start);
  puVar4 = color::yellow;
  lVar17 = sVar7 + sVar5 + sVar13 + sVar9;
  if (lVar17 != 0) {
    if (o->extract == false) {
      if (o->test == false) {
        pcVar16 = "inspecting";
        if (o->list != false) {
          pcVar16 = "listing the contents of";
        }
      }
      else {
        pcVar16 = "testing";
      }
    }
    else {
      pcVar16 = "extracting";
    }
    color::current = color::yellow;
    if (color::yellow == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x177120);
    }
    else {
      sVar10 = strlen(color::yellow);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,puVar4,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Use the --gog option to try ",0x1c);
    sVar10 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    pcVar16 = "these files";
    if (lVar17 == 1) {
      pcVar16 = "this file";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,pcVar16,(ulong)(lVar17 != 1) * 2 + 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".\n",2);
    puVar4 = color::reset;
    color::current = color::reset;
    if (color::reset == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x177120);
    }
    else {
      sVar10 = strlen(color::reset);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,puVar4,sVar10);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_pathname._M_dataplus._M_p != &local_50.m_pathname.field_2) {
    operator_delete(local_50.m_pathname._M_dataplus._M_p,
                    local_50.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void probe_bin_files(const extract_options & o, const setup::info & info,
                     const fs::path & setup_file, bool external) {
	
	boost::filesystem::path dir = setup_file.parent_path();
	std::string basename = util::as_string(setup_file.stem());
	
	size_t bin_count = 0;
	bin_count += probe_bin_file_series(o, info, dir, basename + ".bin");
	bin_count += probe_bin_file_series(o, info, dir, basename + "-0" + ".bin");
	

	boost::uint32_t max_slice = 0;
	if(external) {
		BOOST_FOREACH(const setup::data_entry & location, info.data_entries) {
			max_slice = std::max(max_slice, location.chunk.first_slice);
			max_slice = std::max(max_slice, location.chunk.last_slice);
		}
	}
	
	size_t slice =  0;
	size_t format = 1;
	if(external && info.header.slices_per_disk == 1) {
		slice = size_t(max_slice) + 1;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	slice = 0;
	format = 2;
	if(external && info.header.slices_per_disk != 1) {
		slice = size_t(max_slice) + 1;
		format = info.header.slices_per_disk;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	if(bin_count) {
		const char * verb = "inspecting";
		if(o.extract) {
			verb = "extracting";
		} else if(o.test) {
			verb = "testing";
		} else if(o.list) {
			verb = "listing the contents of";
		}
		std::cerr << color::yellow << "Use the --gog option to try " << verb << " "
		          << (bin_count > 1 ? "these files" : "this file") << ".\n" << color::reset;
	}
	
}